

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_operator_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundOperatorExpression::Copy(BoundOperatorExpression *this)

{
  ExpressionType type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  BoundOperatorExpression *this_00;
  pointer pBVar2;
  pointer pEVar3;
  Expression *in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  templated_unique_single_t copy;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_50;
  LogicalType local_48;
  
  this_00 = (BoundOperatorExpression *)operator_new(0x70);
  type = (in_RSI->super_BaseExpression).type;
  LogicalType::LogicalType(&local_48,&in_RSI->return_type);
  BoundOperatorExpression(this_00,type,&local_48);
  local_50._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_48);
  pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_50);
  Expression::CopyProperties(&pBVar2->super_Expression,in_RSI);
  this_01 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
            in_RSI[1].super_BaseExpression._vptr_BaseExpression;
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            &in_RSI[1].super_BaseExpression.type;
  if (this_01 != puVar1) {
    do {
      pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                             *)&local_50);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_48,pEVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar2->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_48);
      if ((Expression *)local_48._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_50._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundOperatorExpression::Copy() const {
	auto copy = make_uniq<BoundOperatorExpression>(type, return_type);
	copy->CopyProperties(*this);
	for (auto &child : children) {
		copy->children.push_back(child->Copy());
	}
	return std::move(copy);
}